

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (string *__return_storage_ptr__,detail *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v,string *delim)

{
  string *psVar1;
  ostream *poVar2;
  string *psVar3;
  ostringstream s;
  ostringstream aoStack_1a8 [376];
  
  ::std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  psVar3 = *(string **)this;
  psVar1 = *(string **)(this + 8);
  if (psVar3 != psVar1) {
    ::std::operator<<((ostream *)aoStack_1a8,psVar3);
    psVar3 = psVar3 + 0x20;
  }
  for (; psVar3 != psVar1; psVar3 = psVar3 + 0x20) {
    poVar2 = ::std::operator<<((ostream *)aoStack_1a8,(string *)v);
    ::std::operator<<(poVar2,psVar3);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string join(const T &v, std::string delim = ",") {
    std::ostringstream s;
    auto beg = std::begin(v);
    auto end = std::end(v);
    if(beg != end)
        s << *beg++;
    while(beg != end) {
        s << delim << *beg++;
    }
    return s.str();
}